

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_fence(void)

{
  long lVar1;
  long lVar2;
  
  if (GA_fence_set < 1) {
    pnga_error("ga_fence: fence not initialized",0);
  }
  GA_fence_set = GA_fence_set + -1;
  lVar1 = GAnproc;
  for (lVar2 = 0; lVar2 < lVar1; lVar2 = lVar2 + 1) {
    if (fence_array[lVar2] != '\0') {
      ARMCI_Fence((int)lVar2);
      lVar1 = GAnproc;
    }
  }
  memset(fence_array,0,(long)(int)lVar1);
  return;
}

Assistant:

void pnga_fence()
{
    int proc;
    if(GA_fence_set<1)pnga_error("ga_fence: fence not initialized",0);
    GA_fence_set--;
    for(proc=0;proc<GAnproc;proc++)if(fence_array[proc])ARMCI_Fence(proc);
    bzero(fence_array,(int)GAnproc);
}